

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.hpp
# Opt level: O2

void __thiscall
m2d::savanna::request<get_yahoo_endpoint>::request
          (request<get_yahoo_endpoint> *this,get_yahoo_endpoint *e)

{
  _Rb_tree_header *p_Var1;
  
  this->follow_location = false;
  get_yahoo_endpoint::get_yahoo_endpoint(&this->endpoint,e);
  this->version = 0xb;
  (this->body)._M_dataplus._M_p = (pointer)&(this->body).field_2;
  (this->body)._M_string_length = 0;
  (this->body).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->header_fields)._M_t._M_impl.super__Rb_tree_header;
  (this->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->header_fields)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->timeout_interval).__r = 30000000000;
  return;
}

Assistant:

request(Endpoint e)
		    : endpoint(e)
		{
			static_assert(std::is_base_of<savanna::endpoint, Endpoint>::value, "Endpoint not derived from endpoint_t");
		}